

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O1

void trace_start(jit_State *J)

{
  uint8_t *puVar1;
  TraceNo TVar2;
  lua_State *L;
  TValue *pTVar3;
  SnapEntry *pSVar4;
  uint uVar5;
  uint uVar6;
  GCRef *pGVar7;
  ptrdiff_t argbase;
  GCstr *pGVar8;
  uint lim;
  ulong uVar9;
  
  if ((J->pt->flags & 8) == 0) {
    if (J->freetrace == 0) {
      J->freetrace = 1;
    }
    uVar9 = (ulong)J->freetrace;
    uVar6 = J->sizetrace;
    if (J->freetrace < uVar6) {
      do {
        if (J->trace[uVar9].gcptr32 == 0) {
          J->freetrace = (int)uVar9 + 1;
          goto LAB_00147e35;
        }
        uVar9 = uVar9 + 1;
        J->freetrace = (TraceNo)uVar9;
      } while (uVar6 != uVar9);
    }
    uVar5 = J->param[0] + 1;
    if (0xfffe < uVar5) {
      uVar5 = 0xffff;
    }
    lim = 2;
    if (2 < uVar5) {
      lim = uVar5;
    }
    uVar9 = 0;
    if (uVar6 < lim) {
      pGVar7 = (GCRef *)lj_mem_grow(J->L,J->trace,&J->sizetrace,lim,4);
      J->trace = pGVar7;
      if (uVar6 < J->sizetrace) {
        memset(pGVar7 + uVar6,0,(ulong)(J->sizetrace + ~uVar6) * 4 + 4);
      }
      uVar9 = (ulong)J->freetrace;
    }
LAB_00147e35:
    if ((int)uVar9 != 0) {
      J->trace[uVar9 & 0xffffffff].gcptr32 = (uint32_t)J;
      (J->cur).traceno = 0;
      (J->cur).link = 0;
      (J->cur).root = 0;
      (J->cur).nextroot = 0;
      (J->cur).nextside = 0;
      (J->cur).sinktags = '\0';
      (J->cur).topslot = '\0';
      (J->cur).linktype = '\0';
      (J->cur).unused1 = '\0';
      *(undefined2 *)&(J->cur).field_0x5e = 0;
      (J->cur).ir = (IRIns *)0x0;
      (J->cur).nk = 0;
      (J->cur).nsnapmap = 0;
      (J->cur).nextgc = 0;
      (J->cur).marked = '\0';
      (J->cur).gct = '\0';
      (J->cur).nsnap = 0;
      (J->cur).nins = 0;
      (J->cur).gclist = 0;
      (J->cur).startpt = 0;
      (J->cur).startpc = 0;
      (J->cur).startins = 0;
      (J->cur).szmcode = 0;
      (J->cur).mcode = (MCode *)0x0;
      (J->cur).mcloop = 0;
      (J->cur).nchild = 0;
      (J->cur).spadjust = 0;
      (J->cur).traceno = (TraceNo1)uVar9;
      (J->cur).nk = 0x8000;
      (J->cur).nins = 0x8000;
      (J->cur).ir = J->irbuf;
      pSVar4 = J->snapmapbuf;
      (J->cur).snap = J->snapbuf;
      (J->cur).snapmap = pSVar4;
      J->postproc = LJ_POST_NONE;
      J->retryrec = '\0';
      J->ktrace = 0;
      J->mergesnap = '\0';
      J->needsnap = '\0';
      J->guardemit = '\0';
      J->bcskip = '\0';
      (J->cur).startpt.gcptr32 = *(uint32_t *)&J->pt;
      L = J->L;
      if ((*(byte *)((ulong)(L->glref).ptr32 + 0x10b) & 2) != 0) {
        argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TRACE);
        if (argbase != 0) {
          pTVar3 = L->top;
          L->top = pTVar3 + 1;
          pGVar8 = lj_str_new(L,"start",5);
          (pTVar3->u32).lo = (uint32_t)pGVar8;
          (pTVar3->field_2).it = 0xfffffffb;
          pTVar3 = L->top;
          L->top = pTVar3 + 1;
          pTVar3->n = (double)(int)uVar9;
          pTVar3 = L->top;
          L->top = pTVar3 + 1;
          (pTVar3->field_2).field_0 =
               *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)&J->fn;
          (pTVar3->field_2).it = 0xfffffff7;
          pTVar3 = L->top;
          L->top = pTVar3 + 1;
          pTVar3->n = (double)(int)((ulong)((long)J->pc + (-0x40 - (long)J->pt)) >> 2);
          TVar2 = J->parent;
          if (TVar2 == 0) {
            uVar6 = (byte)*J->pc - 0x41;
            if ((uVar6 < 5) && ((0x13U >> (uVar6 & 0x1f) & 1) != 0)) {
              pTVar3 = L->top;
              L->top = pTVar3 + 1;
              pTVar3->n = (double)(int)J->exitno;
              pTVar3 = L->top;
              L->top = pTVar3 + 1;
              pTVar3->u64 = 0xbff0000000000000;
            }
          }
          else {
            pTVar3 = L->top;
            L->top = pTVar3 + 1;
            pTVar3->n = (double)(int)TVar2;
            pTVar3 = L->top;
            L->top = pTVar3 + 1;
            pTVar3->n = (double)(int)J->exitno;
          }
          lj_vmevent_call(L,argbase);
        }
      }
      lj_record_setup(J);
      return;
    }
    lj_trace_flushall(J->L);
  }
  else if ((J->parent == 0) && (J->exitno == 0)) {
    *(char *)J->pc = (char)*J->pc + '\x01';
    puVar1 = &J->pt->flags;
    *puVar1 = *puVar1 | 0x10;
  }
  J->state = LJ_TRACE_IDLE;
  return;
}

Assistant:

static void trace_start(jit_State *J)
{
  lua_State *L;
  TraceNo traceno;

  if ((J->pt->flags & PROTO_NOJIT)) {  /* JIT disabled for this proto? */
    if (J->parent == 0 && J->exitno == 0) {
      /* Lazy bytecode patching to disable hotcount events. */
      lj_assertJ(bc_op(*J->pc) == BC_FORL || bc_op(*J->pc) == BC_ITERL ||
		 bc_op(*J->pc) == BC_LOOP || bc_op(*J->pc) == BC_FUNCF,
		 "bad hot bytecode %d", bc_op(*J->pc));
      setbc_op(J->pc, (int)bc_op(*J->pc)+(int)BC_ILOOP-(int)BC_LOOP);
      J->pt->flags |= PROTO_ILOOP;
    }
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }

  /* Get a new trace number. */
  traceno = trace_findfree(J);
  if (LJ_UNLIKELY(traceno == 0)) {  /* No free trace? */
    lj_assertJ((J2G(J)->hookmask & HOOK_GC) == 0,
	       "recorder called from GC hook");
    lj_trace_flushall(J->L);
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }
  setgcrefp(J->trace[traceno], &J->cur);

  /* Setup enough of the current trace to be able to send the vmevent. */
  memset(&J->cur, 0, sizeof(GCtrace));
  J->cur.traceno = traceno;
  J->cur.nins = J->cur.nk = REF_BASE;
  J->cur.ir = J->irbuf;
  J->cur.snap = J->snapbuf;
  J->cur.snapmap = J->snapmapbuf;
  J->mergesnap = 0;
  J->needsnap = 0;
  J->bcskip = 0;
  J->guardemit.irt = 0;
  J->postproc = LJ_POST_NONE;
  lj_resetsplit(J);
  J->retryrec = 0;
  J->ktrace = 0;
  setgcref(J->cur.startpt, obj2gco(J->pt));

  L = J->L;
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "start"));
    setintV(L->top++, traceno);
    setfuncV(L, L->top++, J->fn);
    setintV(L->top++, proto_bcpos(J->pt, J->pc));
    if (J->parent) {
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
    } else {
      BCOp op = bc_op(*J->pc);
      if (op == BC_CALLM || op == BC_CALL || op == BC_ITERC) {
	setintV(L->top++, J->exitno);  /* Parent of stitched trace. */
	setintV(L->top++, -1);
      }
    }
  );
  lj_record_setup(J);
}